

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_zip_trn(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  uint uVar2;
  uint destidx;
  uint uVar3;
  uint uVar4;
  TCGv_i64 tcg_src;
  TCGv_i64 tcg_src_00;
  TCGv_i64 tcg_dest;
  sbyte sVar5;
  uint uVar6;
  int iVar7;
  TCGv_i64 ret;
  int iVar8;
  uintptr_t o;
  MemOp memop;
  uint uVar9;
  uint uVar10;
  uintptr_t o_1;
  ulong uVar11;
  uint uVar12;
  short local_6c;
  int base;
  
  memop = insn >> 0x16 & MO_64;
  uVar2 = insn >> 0x1e & 1;
  sVar5 = (char)memop + 3;
  uVar12 = uVar2 * 0x40 + 0x40 >> sVar5;
  uVar6 = insn >> 0xc & 3;
  if ((uVar6 != 0 & (memop != MO_64 | (byte)uVar2)) == 0) {
    unallocated_encoding_aarch64(s);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = fp_access_check(s);
  if (!_Var1) {
    return;
  }
  destidx = insn & 0x1f;
  uVar3 = insn >> 5;
  iVar8 = 0;
  tcg_src = tcg_const_i64_aarch64(tcg_ctx,0);
  tcg_src_00 = tcg_const_i64_aarch64(tcg_ctx,0);
  tcg_dest = tcg_temp_new_i64(tcg_ctx);
  uVar2 = uVar12 >> 1;
  if ((insn & 0x4000) == 0) {
    uVar2 = 0;
  }
  uVar9 = (insn & 0x4000) >> 0xe;
  uVar11 = 0;
  do {
    uVar10 = (uint)uVar11;
    if (uVar12 == uVar10) {
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
      write_vec_element(s,tcg_src,destidx,0,MO_64);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_src + (long)tcg_ctx));
      write_vec_element(s,tcg_src_00,destidx,1,MO_64);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_src_00 + (long)tcg_ctx));
      clear_vec_high(s,true,destidx);
      return;
    }
    local_6c = (short)uVar6;
    uVar4 = uVar3;
    if (local_6c == 3) {
      iVar7 = (int)(uVar11 >> 1) + uVar2;
      if ((uVar11 & 1) != 0) goto LAB_00638e3b;
    }
    else if (uVar6 == 2) {
      if ((uVar11 & 1) == 0) {
        iVar7 = uVar9 + uVar10;
      }
      else {
        iVar7 = (uVar10 & 0x7ffffffe) + uVar9;
LAB_00638e3b:
        uVar4 = insn >> 0x10;
      }
    }
    else {
      if (uVar12 >> 1 <= uVar10) {
        iVar7 = (uVar9 - (uVar12 & 0xfffffffe)) + iVar8;
        goto LAB_00638e3b;
      }
      iVar7 = uVar9 + iVar8;
    }
    read_vec_element(s,tcg_dest,uVar4 & 0x1f,iVar7,memop);
    iVar7 = uVar10 << sVar5;
    if (iVar7 < 0x40) {
      tcg_gen_shli_i64_aarch64(tcg_ctx,tcg_dest,tcg_dest,(long)iVar7);
      ret = tcg_src;
    }
    else {
      tcg_gen_shli_i64_aarch64(tcg_ctx,tcg_dest,tcg_dest,(ulong)(iVar7 - 0x40));
      ret = tcg_src_00;
    }
    tcg_gen_or_i64_aarch64(tcg_ctx,ret,ret,tcg_dest);
    uVar11 = (ulong)(uVar10 + 1);
    iVar8 = iVar8 + 2;
  } while( true );
}

Assistant:

static void disas_simd_zip_trn(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int rm = extract32(insn, 16, 5);
    int size = extract32(insn, 22, 2);
    /* opc field bits [1:0] indicate ZIP/UZP/TRN;
     * bit 2 indicates 1 vs 2 variant of the insn.
     */
    int opcode = extract32(insn, 12, 2);
    bool part = extract32(insn, 14, 1);
    bool is_q = extract32(insn, 30, 1);
    int esize = 8 << size;
    int i, ofs;
    int datasize = is_q ? 128 : 64;
    int elements = datasize / esize;
    TCGv_i64 tcg_res, tcg_resl, tcg_resh;

    if (opcode == 0 || (size == 3 && !is_q)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_resl = tcg_const_i64(tcg_ctx, 0);
    tcg_resh = tcg_const_i64(tcg_ctx, 0);
    tcg_res = tcg_temp_new_i64(tcg_ctx);

    for (i = 0; i < elements; i++) {
        switch (opcode) {
        case 1: /* UZP1/2 */
        {
            int midpoint = elements / 2;
            if (i < midpoint) {
                read_vec_element(s, tcg_res, rn, 2 * i + part, size);
            } else {
                read_vec_element(s, tcg_res, rm,
                                 2 * (i - midpoint) + part, size);
            }
            break;
        }
        case 2: /* TRN1/2 */
            if (i & 1) {
                read_vec_element(s, tcg_res, rm, (i & ~1) + part, size);
            } else {
                read_vec_element(s, tcg_res, rn, (i & ~1) + part, size);
            }
            break;
        case 3: /* ZIP1/2 */
        {
            int base = part * elements / 2;
            if (i & 1) {
                read_vec_element(s, tcg_res, rm, base + (i >> 1), size);
            } else {
                read_vec_element(s, tcg_res, rn, base + (i >> 1), size);
            }
            break;
        }
        default:
            g_assert_not_reached();
        }

        ofs = i * esize;
        if (ofs < 64) {
            tcg_gen_shli_i64(tcg_ctx, tcg_res, tcg_res, ofs);
            tcg_gen_or_i64(tcg_ctx, tcg_resl, tcg_resl, tcg_res);
        } else {
            tcg_gen_shli_i64(tcg_ctx, tcg_res, tcg_res, ofs - 64);
            tcg_gen_or_i64(tcg_ctx, tcg_resh, tcg_resh, tcg_res);
        }
    }

    tcg_temp_free_i64(tcg_ctx, tcg_res);

    write_vec_element(s, tcg_resl, rd, 0, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resl);
    write_vec_element(s, tcg_resh, rd, 1, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resh);
    clear_vec_high(s, true, rd);
}